

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O2

void MatrixDisplay(Matrix_t sMatrix)

{
  float *pfVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  
  pfVar1 = sMatrix.pMatrix;
  uVar4 = sMatrix._9_4_ & 0xff;
  printf("ROW:%d,COLUMN:%d\n",(ulong)(sMatrix._8_4_ & 0xff),(ulong)uVar4);
  for (uVar2 = 0; uVar2 != (sMatrix._8_8_ & 0xff); uVar2 = uVar2 + 1) {
    for (uVar3 = 0; uVar4 != uVar3; uVar3 = uVar3 + 1) {
      printf("\t%f",(double)pfVar1[uVar3]);
    }
    putchar(10);
    pfVar1 = (float *)((long)pfVar1 + (ulong)(uVar4 << 2));
  }
  return;
}

Assistant:

void MatrixDisplay(Matrix_t sMatrix)
{
	int i, j;
	printf("ROW:%d,COLUMN:%d\n", sMatrix.row, sMatrix.column);
	for (i = 0; i < sMatrix.row; i++)
	{
		for (j = 0; j < sMatrix.column; j++)
			printf("\t%f", *(sMatrix.pMatrix + i * sMatrix.column + j));
		printf("\n");
	}
}